

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityParamDens.cpp
# Opt level: O2

void __thiscall OpenMD::TetrahedralityParamDens::process(TetrahedralityParamDens *this)

{
  int *piVar1;
  SelectionManager *this_00;
  SelectionManager *this_01;
  char cVar2;
  int iVar3;
  SimInfo *info;
  pointer piVar4;
  uint uVar5;
  StuntDouble *this_02;
  StuntDouble *this_03;
  ostream *poVar6;
  int whichFrame;
  long lVar7;
  ulong uVar8;
  pointer pOVar9;
  double dVar10;
  double local_13f0;
  vector<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  myNeighbors;
  SelectionSet local_13b8;
  int local_139c;
  int local_1398;
  int local_1394;
  int isd2;
  int isd1;
  ulong local_1388;
  long local_1380;
  SelectionEvaluator *local_1378;
  SelectionEvaluator *local_1370;
  ulong local_1368;
  ulong local_1360;
  double local_1358;
  ulong local_1350;
  Vector3d rik;
  Vector3d rk;
  Vector3d vec;
  Vector3d ri;
  Vector<double,_3U> local_12e8;
  Vector<double,_3U> local_12d0;
  Vector3d rkj;
  Vector3d rj;
  DumpReader reader;
  
  Vector<double,_3U>::Vector(&vec.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&ri.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rj.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rk.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rik.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&rkj.super_Vector<double,_3U>);
  myNeighbors.
  super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  myNeighbors.
  super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  myNeighbors.
  super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  info = (this->super_StaticAnalyser).info_;
  cVar2 = (info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  DumpReader::DumpReader(&reader,info,&(this->super_StaticAnalyser).dumpFilename_);
  local_139c = DumpReader::getNFrames(&reader);
  local_1370 = &this->evaluator1_;
  this_00 = &this->seleMan1_;
  local_1378 = &this->evaluator2_;
  this_01 = &this->seleMan2_;
  for (whichFrame = 0; whichFrame < local_139c;
      whichFrame = whichFrame + (this->super_StaticAnalyser).step_) {
    DumpReader::readFrame(&reader,whichFrame);
    this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
    if ((this->evaluator1_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_13b8,local_1370);
      SelectionManager::setSelectionSet(this_00,&local_13b8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_13b8.bitsets_);
    }
    if ((this->evaluator2_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_13b8,local_1378);
      SelectionManager::setSelectionSet(this_01,&local_13b8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_13b8.bitsets_);
    }
    this_02 = SelectionManager::beginSelected(this_00,&isd1);
    local_1394 = whichFrame;
    while (this_02 != (StuntDouble *)0x0) {
      if (myNeighbors.
          super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          myNeighbors.
          super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        myNeighbors.
        super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             myNeighbors.
             super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      iVar3 = this_02->globalIndex_;
      this_03 = SelectionManager::beginSelected(this_01,&isd2);
      while (this_03 != (StuntDouble *)0x0) {
        if (this_03->globalIndex_ != iVar3) {
          StuntDouble::getPos((Vector3d *)&local_12d0,this_02);
          StuntDouble::getPos((Vector3d *)&local_12e8,this_03);
          operator-((Vector<double,_3U> *)&local_13b8,&local_12d0,&local_12e8);
          Vector3<double>::operator=(&vec,(Vector<double,_3U> *)&local_13b8);
          if (cVar2 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,&vec);
          }
          pOVar9 = (pointer)Vector<double,_3U>::length(&vec.super_Vector<double,_3U>);
          if ((double)pOVar9 < this->rCut_) {
            local_13b8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_start = pOVar9;
            local_13b8.bitsets_.
            super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)this_03;
            std::
            vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>
            ::emplace_back<std::pair<double,OpenMD::StuntDouble*>>
                      ((vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>
                        *)&myNeighbors,(pair<double,_OpenMD::StuntDouble_*> *)&local_13b8);
          }
        }
        this_03 = SelectionManager::nextSelected(this_01,&isd2);
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::pair<double,OpenMD::StuntDouble*>*,std::vector<std::pair<double,OpenMD::StuntDouble*>,std::allocator<std::pair<double,OpenMD::StuntDouble*>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (myNeighbors.
                 super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 myNeighbors.
                 super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      local_1350 = (long)myNeighbors.
                         super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)myNeighbors.
                         super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4;
      if (3 < local_1350) {
        local_1350 = 4;
      }
      iVar3 = (int)local_1350;
      uVar5 = iVar3 - 1;
      StuntDouble::getPos((Vector3d *)&local_13b8,this_02);
      Vector<double,_3U>::operator=(&rk.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13b8);
      local_1398 = (int)((double)(int)(uVar5 * iVar3) * 0.5);
      local_1358 = (double)local_1398;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      local_1368 = (ulong)uVar5;
      local_1380 = 0x18;
      local_1388 = 1;
      local_13f0 = 1.0;
      uVar8 = 0;
      while (uVar8 != local_1368) {
        StuntDouble::getPos((Vector3d *)&local_13b8,
                            myNeighbors.
                            super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar8].second);
        Vector<double,_3U>::operator=
                  (&ri.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13b8);
        operator-((Vector<double,_3U> *)&local_13b8,&rk.super_Vector<double,_3U>,
                  &ri.super_Vector<double,_3U>);
        Vector3<double>::operator=(&rik,(Vector<double,_3U> *)&local_13b8);
        if (cVar2 != '\0') {
          Snapshot::wrapVector(this->currentSnapshot_,&rik);
        }
        Vector<double,_3U>::normalize(&rik.super_Vector<double,_3U>);
        local_1360 = uVar8 + 1;
        lVar7 = local_1380;
        for (uVar8 = local_1388; uVar8 < local_1350; uVar8 = uVar8 + 1) {
          StuntDouble::getPos((Vector3d *)&local_13b8,
                              *(StuntDouble **)
                               ((long)&(myNeighbors.
                                        super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar7));
          Vector<double,_3U>::operator=
                    (&rj.super_Vector<double,_3U>,(Vector<double,_3U> *)&local_13b8);
          operator-((Vector<double,_3U> *)&local_13b8,&rk.super_Vector<double,_3U>,
                    &rj.super_Vector<double,_3U>);
          Vector3<double>::operator=
                    ((Vector3<double> *)&rkj.super_Vector<double,_3U>,
                     (Vector<double,_3U> *)&local_13b8);
          if (cVar2 != '\0') {
            Snapshot::wrapVector(this->currentSnapshot_,(Vector3d *)&rkj.super_Vector<double,_3U>);
          }
          Vector<double,_3U>::normalize(&rkj.super_Vector<double,_3U>);
          dVar10 = dot<double,3u>(&rik.super_Vector<double,_3U>,&rkj.super_Vector<double,_3U>);
          local_13f0 = local_13f0 +
                       ((dVar10 + 0.3333333333333333) * (dVar10 + 0.3333333333333333) * -2.25) /
                       local_1358;
          lVar7 = lVar7 + 0x10;
        }
        local_1388 = local_1388 + 1;
        local_1380 = local_1380 + 0x10;
        uVar8 = local_1360;
        whichFrame = local_1394;
      }
      if (0 < local_1398) {
        uVar5 = (uint)((local_13f0 - this->MinQ_) / this->deltaQ_);
        if (((int)uVar5 < 0) ||
           (piVar4 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
           (int)((ulong)((long)(this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar4) >> 2) <=
           (int)uVar5)) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"binNo = ");
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,uVar5);
          std::operator<<(poVar6," Qk = ");
          poVar6 = std::ostream::_M_insert<double>(local_13f0);
          std::operator<<(poVar6,"\n");
        }
        else {
          piVar1 = piVar4 + uVar5;
          *piVar1 = *piVar1 + 1;
        }
        this->count_ = this->count_ + 1;
      }
      this_02 = SelectionManager::nextSelected(this_00,&isd1);
    }
  }
  writeQdens(this);
  DumpReader::~DumpReader(&reader);
  std::
  _Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
  ::~_Vector_base(&myNeighbors.
                   super__Vector_base<std::pair<double,_OpenMD::StuntDouble_*>,_std::allocator<std::pair<double,_OpenMD::StuntDouble_*>_>_>
                 );
  return;
}

Assistant:

void TetrahedralityParamDens::process() {
    StuntDouble* sd;
    StuntDouble* sd2;
    StuntDouble* sdi;
    StuntDouble* sdj;
    int myIndex;
    Vector3d vec;
    Vector3d ri, rj, rk, rik, rkj;
    RealType r;
    RealType cospsi;
    RealType Qk;
    std::vector<std::pair<RealType, StuntDouble*>> myNeighbors;
    int isd1;
    int isd2;
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      // Mat3x3d hmat = currentSnapshot_->getHmat();
      // zBox_.push_back(hmat(2,2));

      // RealType halfBoxZ_ = hmat(2,2) / 2.0;

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:
      for (sd = seleMan1_.beginSelected(isd1); sd != NULL;
           sd = seleMan1_.nextSelected(isd1)) {
        myIndex = sd->getGlobalIndex();

        Qk = 1.0;
        myNeighbors.clear();

        for (sd2 = seleMan2_.beginSelected(isd2); sd2 != NULL;
             sd2 = seleMan2_.nextSelected(isd2)) {
          if (sd2->getGlobalIndex() != myIndex) {
            vec = sd->getPos() - sd2->getPos();

            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(vec);

            r = vec.length();

            // Check to see if neighbor is in bond cutoff

            if (r < rCut_) {
              myNeighbors.push_back(std::make_pair(r, sd2));
              if (myIndex == 513) {
                // std::cerr<< "sd2 index = " << sd2->getGlobalIndex() << "\n";
              }
            }
          }
        }

        // Sort the vector using predicate and std::sort
        std::sort(myNeighbors.begin(), myNeighbors.end());

        // Use only the 4 closest neighbors to do the rest of the work:

        int nbors = myNeighbors.size() > 4 ? 4 : myNeighbors.size();
        int nang  = int(0.5 * (nbors * (nbors - 1)));
        if (nang < 4) {
          // std::cerr << "nbors = " << nbors << " nang = " << nang << "\n";
        }
        rk = sd->getPos();

        for (int i = 0; i < nbors - 1; i++) {
          sdi = myNeighbors[i].second;
          ri  = sdi->getPos();
          rik = rk - ri;
          if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(rik);

          rik.normalize();

          for (int j = i + 1; j < nbors; j++) {
            sdj = myNeighbors[j].second;
            rj  = sdj->getPos();
            rkj = rk - rj;
            if (usePeriodicBoundaryConditions_)
              currentSnapshot_->wrapVector(rkj);
            rkj.normalize();

            cospsi = dot(rik, rkj);

            // Calculates scaled Qk for each molecule using calculated
            // angles from 4 or fewer nearest neighbors.
            Qk -= (pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang);
            /*if (Qk < 0 ) {
            std::cerr << "(pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang)" <<
            (pow(cospsi + 1.0 / 3.0, 2) * 2.25 / nang) << "\n"; std::cerr << "Qk
            = " << Qk << " nang = " << nang <<  " nbors = " << nbors << "\n";
            std::cerr << "myIndex = " << myIndex <<
            "\n";
            }*/
          }
        }

        // Based on the molecule's q value, populate the histogram.
        if (nang > 0) {
          int binNo = int((Qk - MinQ_) / deltaQ_);

          if (binNo < int(sliceCount_.size()) && binNo >= 0) {
            sliceCount_[binNo] += 1;
          } else {
            std::cerr << "binNo = " << binNo << " Qk = " << Qk << "\n";
            // std::cerr << "nbors = " << nbors << "\n";
          }

          // std::cout << "count = " << count_ << "\n";
          count_++;
        }
      }
    }
    writeQdens();
  }